

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O3

void featurePad(pBox *pbox,pBox *outpBox,int pad,int padw,int padh)

{
  mydataFmt *__src;
  int iVar1;
  int iVar2;
  int iVar3;
  mydataFmt *pmVar4;
  
  pmVar4 = outpBox->pdata;
  __src = pbox->pdata;
  iVar3 = outpBox->channel;
  iVar2 = outpBox->height;
  if (pad == -1) {
    if (0 < iVar2 * iVar3) {
      iVar1 = 0;
      do {
        if ((iVar1 % iVar2 < padh) || (~padh + iVar2 < iVar1 % iVar2)) {
          pmVar4 = pmVar4 + outpBox->width;
        }
        else {
          memcpy(pmVar4 + padw,__src,(long)pbox->width << 2);
          pmVar4 = pmVar4 + padw + (long)pbox->width + (long)padw;
          __src = __src + pbox->width;
          iVar2 = outpBox->height;
          iVar3 = outpBox->channel;
        }
        iVar1 = iVar1 + 1;
      } while (iVar1 < iVar2 * iVar3);
    }
  }
  else if (0 < iVar2 * iVar3) {
    iVar1 = 0;
    do {
      if ((iVar1 % iVar2 < pad) || (~pad + iVar2 < iVar1 % iVar2)) {
        pmVar4 = pmVar4 + outpBox->width;
      }
      else {
        memcpy(pmVar4 + pad,__src,(long)pbox->width << 2);
        pmVar4 = pmVar4 + pad + (long)pbox->width + (long)pad;
        __src = __src + pbox->width;
        iVar2 = outpBox->height;
        iVar3 = outpBox->channel;
      }
      iVar1 = iVar1 + 1;
    } while (iVar1 < iVar2 * iVar3);
  }
  return;
}

Assistant:

void featurePad(const pBox *pbox, pBox *outpBox, const int pad, const int padw, const int padh) {
    mydataFmt *p = outpBox->pdata;
    mydataFmt *pIn = pbox->pdata;
    if (pad == -1) {
        for (int row = 0; row < outpBox->channel * outpBox->height; row++) {
            if ((row % outpBox->height) < padh || (row % outpBox->height > (outpBox->height - padh - 1))) {
                p += outpBox->width;
                continue;
            }
            p += padw;
            memcpy(p, pIn, pbox->width * sizeof(mydataFmt));
            p += pbox->width + padw;
            pIn += pbox->width;
        }
    } else {
        for (int row = 0; row < outpBox->channel * outpBox->height; row++) {
            if ((row % outpBox->height) < pad || (row % outpBox->height > (outpBox->height - pad - 1))) {
                p += outpBox->width;
                continue;
            }
            p += pad;
            memcpy(p, pIn, pbox->width * sizeof(mydataFmt));
            p += pbox->width + pad;
            pIn += pbox->width;
        }
    }
}